

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double *this;
  bool make_layer_video_00;
  int iVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  byte bVar8;
  int iVar9;
  char *pcVar10;
  ostream *poVar11;
  vector3 local_f00;
  string local_ee8;
  CuttingPlane local_ec8;
  vector3 local_e90;
  vector3 local_e78;
  vector3 local_e60;
  vector3 local_e48;
  string local_e30 [32];
  stringstream local_e10 [8];
  stringstream out_file_name_1;
  ostream local_e00 [376];
  vector3 local_c88;
  string local_c70;
  CuttingPlane local_c50;
  vector3 local_c18;
  vector3 local_c00;
  vector3 local_be8;
  vector3 local_bd0;
  string local_bb8 [32];
  stringstream local_b98 [8];
  stringstream out_file_name;
  ostream local_b88 [380];
  int local_a0c;
  string local_a08 [4];
  int layer_index;
  stringstream local_9e8 [8];
  stringstream temp;
  ostream local_9d8 [376];
  string local_860;
  CuttingPlane local_840;
  vector3 local_808;
  vector3 local_7f0;
  vector3 local_7d8;
  vector3 local_7c0;
  int local_7a4;
  undefined1 local_7a0 [4];
  int layer_count;
  vector3 massive_center;
  CuttingPlane local_770;
  istringstream local_738 [8];
  istringstream ss;
  allocator<char> local_5b1;
  string local_5b0 [39];
  allocator<char> local_589;
  string local_588 [32];
  string local_568 [39];
  allocator<char> local_541;
  string local_540 [39];
  allocator<char> local_519;
  string local_518 [39];
  allocator<char> local_4f1;
  string local_4f0 [39];
  allocator<char> local_4c9;
  string local_4c8 [39];
  allocator<char> local_4a1;
  string local_4a0 [39];
  allocator<char> local_479;
  string local_478 [39];
  allocator<char> local_451;
  string local_450 [39];
  allocator<char> local_429;
  string local_428 [39];
  allocator<char> local_401;
  string local_400 [39];
  allocator<char> local_3d9;
  string local_3d8 [32];
  int local_3b8;
  int local_3b4;
  int make_layer_video_pos;
  int cutting_plane_distance_pos;
  int cutting_plane_normal_pos;
  int layer_before_and_pos;
  int layer_only_pos;
  int transparency_conf_pos;
  int file_conf_pos;
  int nozzle_conf_pos;
  int view_angle_conf_pos;
  int filament_color_conf_pos;
  int camera_lookat_conf_pos;
  int camera_location_conf_pos;
  string temp_string;
  fstream configure_file;
  bool local_146;
  bool local_145;
  bool local_144;
  bool local_143;
  bool local_142;
  bool local_141;
  string local_140;
  bool make_layer_video;
  bool layer_before_and_specified;
  bool layer_only_specified;
  bool camera_position_specified;
  bool angle_specified;
  bool look_at_specified;
  bool in_file_name_specified;
  string in_file_name;
  double layer_before_and;
  double layer_only;
  double transparency;
  double cutting_plane_distance;
  CuttingPlane cutting_plane;
  undefined1 local_b0 [8];
  vector3 cutting_plane_normal;
  undefined1 local_80 [8];
  vector3 filament_color;
  double dStack_60;
  bool has_cutting_plane;
  double nozzle_width;
  double camera_angle;
  vector3 look_at;
  vector3 camera_position_vector;
  char **argv_local;
  int argc_local;
  
  vector3::vector3((vector3 *)&look_at.z,-100.0,-250.0,220.0);
  vector3::vector3((vector3 *)&camera_angle,-100.0,100.0,30.0);
  nozzle_width = 60.0;
  dStack_60 = 0.4;
  filament_color.z._7_1_ = 0;
  vector3::vector3((vector3 *)&cutting_plane_normal.z,0.3,0.8,1.0);
  vector3::operator*((vector3 *)local_80,(vector3 *)&cutting_plane_normal.z,0.59);
  this = &cutting_plane.uniform_normal.z;
  vector3::vector3((vector3 *)this,0.3,0.8,1.0);
  vector3::operator*((vector3 *)local_b0,(vector3 *)this,0.59);
  CuttingPlane::CuttingPlane((CuttingPlane *)&cutting_plane_distance);
  transparency = 0.0;
  layer_only = 0.0;
  layer_before_and = -1.0;
  in_file_name.field_2._8_8_ = 0xbff0000000000000;
  std::__cxx11::string::string(&local_140);
  local_141 = false;
  local_142 = false;
  local_143 = false;
  local_144 = false;
  local_145 = false;
  local_146 = false;
  make_layer_video_00 = false;
  std::operator<<((ostream *)&std::cout,"Reading configurations file...\n");
  std::fstream::fstream((void *)((long)&temp_string.field_2 + 8));
  std::operator|(_S_in,_S_out);
  std::fstream::open(temp_string.field_2._M_local_buf + 8,0x10e78e);
  bVar8 = std::ios::operator!((ios *)((long)&temp_string.field_2 +
                                     *(long *)(temp_string.field_2._8_8_ + -0x18) + 8));
  if ((bVar8 & 1) == 0) {
    std::__cxx11::string::string((string *)&camera_lookat_conf_pos);
    std::operator<<((ostream *)&std::cout,"Parameters derived:\n");
    while (bVar8 = std::ios::eof(), ((bVar8 ^ 0xff) & 1) != 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)(temp_string.field_2._M_local_buf + 8),(string *)&camera_lookat_conf_pos
                );
      pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)&camera_lookat_conf_pos);
      if ((*pcVar10 != '#') ||
         (pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)&camera_lookat_conf_pos),
         *pcVar10 != '#')) {
        filament_color_conf_pos =
             std::__cxx11::string::find((char *)&camera_lookat_conf_pos,0x10e7dd);
        view_angle_conf_pos = std::__cxx11::string::find((char *)&camera_lookat_conf_pos,0x10e7f0);
        nozzle_conf_pos = std::__cxx11::string::find((char *)&camera_lookat_conf_pos,0x10e801);
        file_conf_pos = std::__cxx11::string::find((char *)&camera_lookat_conf_pos,0x10e815);
        transparency_conf_pos = std::__cxx11::string::find((char *)&camera_lookat_conf_pos,0x10e821)
        ;
        layer_only_pos = std::__cxx11::string::find((char *)&camera_lookat_conf_pos,0x10e829);
        layer_before_and_pos = std::__cxx11::string::find((char *)&camera_lookat_conf_pos,0x10e82f);
        cutting_plane_normal_pos =
             std::__cxx11::string::find((char *)&camera_lookat_conf_pos,0x10e83d);
        cutting_plane_distance_pos =
             std::__cxx11::string::find((char *)&camera_lookat_conf_pos,0x10e849);
        make_layer_video_pos = std::__cxx11::string::find((char *)&camera_lookat_conf_pos,0x10e85b);
        local_3b4 = std::__cxx11::string::find((char *)&camera_lookat_conf_pos,0x10e871);
        local_3b8 = std::__cxx11::string::find((char *)&camera_lookat_conf_pos,0x10e889);
        if (-1 < local_3b8) {
          make_layer_video_00 = true;
          std::operator<<((ostream *)&std::cout,"make_layer_video=yes\n");
        }
        iVar1 = filament_color_conf_pos;
        if (-1 < filament_color_conf_pos) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_3d8,"camera_location=v(",&local_3d9);
          iVar9 = std::__cxx11::string::length();
          VectorArgumentExtracterStream
                    ((string *)&camera_lookat_conf_pos,iVar1 + iVar9,(vector3 *)&look_at.z);
          std::__cxx11::string::~string(local_3d8);
          std::allocator<char>::~allocator(&local_3d9);
          local_144 = true;
          poVar11 = std::operator<<((ostream *)&std::cout,"camera_location=");
          poVar11 = operator<<(poVar11,(vector3 *)&look_at.z);
          std::operator<<(poVar11,"\n");
        }
        iVar1 = view_angle_conf_pos;
        if (-1 < view_angle_conf_pos) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_400,"camera_lookat=v(",&local_401);
          iVar9 = std::__cxx11::string::length();
          VectorArgumentExtracterStream
                    ((string *)&camera_lookat_conf_pos,iVar1 + iVar9,(vector3 *)&camera_angle);
          std::__cxx11::string::~string(local_400);
          std::allocator<char>::~allocator(&local_401);
          local_142 = true;
          poVar11 = std::operator<<((ostream *)&std::cout,"camera_lookat=");
          poVar11 = operator<<(poVar11,(vector3 *)&camera_angle);
          std::operator<<(poVar11,"\n");
        }
        iVar1 = nozzle_conf_pos;
        if (-1 < nozzle_conf_pos) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_428,"filament_color=rgb(",&local_429);
          iVar9 = std::__cxx11::string::length();
          VectorArgumentExtracterStream
                    ((string *)&camera_lookat_conf_pos,iVar1 + iVar9,(vector3 *)local_80);
          std::__cxx11::string::~string(local_428);
          std::allocator<char>::~allocator(&local_429);
          poVar11 = std::operator<<((ostream *)&std::cout,"filament_color=");
          poVar11 = operator<<(poVar11,(vector3 *)local_80);
          std::operator<<(poVar11,"\n");
        }
        iVar1 = make_layer_video_pos;
        if (-1 < make_layer_video_pos) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_450,"cutting_plane_normal=v(",&local_451);
          iVar9 = std::__cxx11::string::length();
          VectorArgumentExtracterStream
                    ((string *)&camera_lookat_conf_pos,iVar1 + iVar9,(vector3 *)local_b0);
          std::__cxx11::string::~string(local_450);
          std::allocator<char>::~allocator(&local_451);
          filament_color.z._7_1_ = 1;
          poVar11 = std::operator<<((ostream *)&std::cout,"cutting_plane_normal=");
          poVar11 = operator<<(poVar11,(vector3 *)local_b0);
          std::operator<<(poVar11,"\n");
        }
        iVar1 = file_conf_pos;
        if (-1 < file_conf_pos) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_478,"view_angle=",&local_479);
          iVar9 = std::__cxx11::string::length();
          ValueArgumentExtracterStream
                    ((string *)&camera_lookat_conf_pos,iVar1 + iVar9,&nozzle_width);
          std::__cxx11::string::~string(local_478);
          std::allocator<char>::~allocator(&local_479);
          local_143 = true;
          poVar11 = std::operator<<((ostream *)&std::cout,"view_angle=");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,nozzle_width);
          std::operator<<(poVar11,"\n");
        }
        iVar1 = transparency_conf_pos;
        if (-1 < transparency_conf_pos) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_4a0,"nozzle_diameter=",&local_4a1);
          iVar9 = std::__cxx11::string::length();
          ValueArgumentExtracterStream
                    ((string *)&camera_lookat_conf_pos,iVar1 + iVar9,&stack0xffffffffffffffa0);
          std::__cxx11::string::~string(local_4a0);
          std::allocator<char>::~allocator(&local_4a1);
          poVar11 = std::operator<<((ostream *)&std::cout,"nozzle_diameter=");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,dStack_60);
          std::operator<<(poVar11,"\n");
        }
        iVar1 = layer_before_and_pos;
        if (-1 < layer_before_and_pos) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_4c8,"transparency=",&local_4c9);
          iVar9 = std::__cxx11::string::length();
          ValueArgumentExtracterStream((string *)&camera_lookat_conf_pos,iVar1 + iVar9,&layer_only);
          std::__cxx11::string::~string(local_4c8);
          std::allocator<char>::~allocator(&local_4c9);
          poVar11 = std::operator<<((ostream *)&std::cout,"transparency=");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,layer_only);
          std::operator<<(poVar11,"\n");
        }
        iVar1 = cutting_plane_normal_pos;
        if (-1 < cutting_plane_normal_pos) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_4f0,"layer_only=",&local_4f1);
          iVar9 = std::__cxx11::string::length();
          ValueArgumentExtracterStream
                    ((string *)&camera_lookat_conf_pos,iVar1 + iVar9,&layer_before_and);
          std::__cxx11::string::~string(local_4f0);
          std::allocator<char>::~allocator(&local_4f1);
          if (0.0 <= layer_before_and) {
            local_145 = true;
            poVar11 = std::operator<<((ostream *)&std::cout,"layer_only=");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,layer_before_and);
            std::operator<<(poVar11,"\n");
          }
        }
        iVar1 = cutting_plane_distance_pos;
        if (-1 < cutting_plane_distance_pos) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_518,"layer_before_and=",&local_519);
          iVar9 = std::__cxx11::string::length();
          ValueArgumentExtracterStream
                    ((string *)&camera_lookat_conf_pos,iVar1 + iVar9,
                     (double *)((long)&in_file_name.field_2 + 8));
          std::__cxx11::string::~string(local_518);
          std::allocator<char>::~allocator(&local_519);
          if (0.0 <= (double)in_file_name.field_2._8_8_) {
            local_146 = true;
            poVar11 = std::operator<<((ostream *)&std::cout,"layer_before_and=");
            poVar11 = (ostream *)
                      std::ostream::operator<<(poVar11,(double)in_file_name.field_2._8_8_);
            std::operator<<(poVar11,"\n");
          }
        }
        iVar1 = local_3b4;
        if (-1 < local_3b4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_540,"cutting_plane_distance=",&local_541);
          iVar9 = std::__cxx11::string::length();
          ValueArgumentExtracterStream
                    ((string *)&camera_lookat_conf_pos,iVar1 + iVar9,&transparency);
          std::__cxx11::string::~string(local_540);
          std::allocator<char>::~allocator(&local_541);
          poVar11 = std::operator<<((ostream *)&std::cout,"cutting_plane_distance=");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,transparency);
          std::operator<<(poVar11,"\n");
        }
        if (-1 < layer_only_pos) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_588,"file=",&local_589);
          std::__cxx11::string::length();
          std::__cxx11::string::size();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_5b0,"file=",&local_5b1);
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_568,(ulong)&camera_lookat_conf_pos);
          std::__cxx11::string::operator=(&local_140,local_568);
          std::__cxx11::string::~string(local_568);
          std::__cxx11::string::~string(local_5b0);
          std::allocator<char>::~allocator(&local_5b1);
          std::__cxx11::string::~string(local_588);
          std::allocator<char>::~allocator(&local_589);
          local_141 = true;
          std::__cxx11::istringstream::istringstream(local_738,&local_140,_S_in);
          std::operator>>((istream *)local_738,&local_140);
          poVar11 = std::operator<<((ostream *)&std::cout,"file=");
          poVar11 = std::operator<<(poVar11,&local_140);
          std::operator<<(poVar11,"\n");
          std::__cxx11::istringstream::~istringstream(local_738);
        }
      }
    }
    if ((filament_color.z._7_1_ & 1) != 0) {
      vector3::vector3((vector3 *)&massive_center.z,(vector3 *)local_b0);
      CuttingPlane::CuttingPlane(&local_770,(vector3 *)&massive_center.z,transparency);
      memcpy(&cutting_plane_distance,&local_770,0x38);
    }
    std::__cxx11::string::~string((string *)&camera_lookat_conf_pos);
    vector3::vector3((vector3 *)local_7a0,0.0,0.0,0.0);
    local_7a4 = 0;
    vector3::vector3(&local_7c0,(vector3 *)&look_at.z);
    vector3::vector3(&local_7d8,(vector3 *)&camera_angle);
    dVar7 = nozzle_width;
    dVar6 = dStack_60;
    bVar8 = filament_color.z._7_1_;
    vector3::vector3(&local_7f0,(vector3 *)local_80);
    vector3::vector3(&local_808,(vector3 *)local_b0);
    CuttingPlane::CuttingPlane(&local_840,(CuttingPlane *)&cutting_plane_distance);
    dVar5 = transparency;
    dVar4 = layer_only;
    dVar3 = layer_before_and;
    uVar2 = in_file_name.field_2._8_8_;
    std::__cxx11::string::string((string *)&local_860,&local_140);
    GetMassiveCenter(&local_7c0,&local_7d8,dVar7,dVar6,(bool)(bVar8 & 1),&local_7f0,&local_808,
                     &local_840,dVar5,dVar4,dVar3,(double)uVar2,&local_860,local_141,local_142,
                     local_143,local_144,local_145,local_146,(vector3 *)local_7a0,&local_7a4);
    std::__cxx11::string::~string((string *)&local_860);
    poVar11 = std::operator<<((ostream *)&std::cout,"Layer count: ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_7a4);
    std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<((ostream *)&std::cout,"Gcode Massive center: ");
    poVar11 = operator<<(poVar11,(vector3 *)local_7a0);
    std::operator<<(poVar11,"\n");
    std::operator<<((ostream *)&std::cout,"Move the hole print to the original point.\n");
    std::operator<<((ostream *)&std::cout,"Writing POV-Ray file...\n");
    if (make_layer_video_00 == false) {
      std::__cxx11::stringstream::stringstream(local_e10);
      std::__cxx11::string::find((char *)&local_140,0x10e973);
      std::__cxx11::string::substr((ulong)local_e30,(ulong)&local_140);
      std::operator<<(local_e00,local_e30);
      std::__cxx11::string::~string(local_e30);
      vector3::vector3(&local_e48,(vector3 *)&look_at.z);
      vector3::vector3(&local_e60,(vector3 *)&camera_angle);
      dVar7 = nozzle_width;
      dVar6 = dStack_60;
      bVar8 = filament_color.z._7_1_;
      vector3::vector3(&local_e78,(vector3 *)local_80);
      vector3::vector3(&local_e90,(vector3 *)local_b0);
      CuttingPlane::CuttingPlane(&local_ec8,(CuttingPlane *)&cutting_plane_distance);
      dVar5 = transparency;
      dVar4 = layer_only;
      dVar3 = layer_before_and;
      uVar2 = in_file_name.field_2._8_8_;
      std::__cxx11::string::string((string *)&local_ee8,&local_140);
      vector3::vector3(&local_f00,(vector3 *)local_7a0);
      Generate_single_file
                (&local_e48,&local_e60,dVar7,dVar6,(bool)(bVar8 & 1),&local_e78,&local_e90,
                 &local_ec8,dVar5,dVar4,dVar3,(double)uVar2,&local_ee8,local_141,local_142,local_143
                 ,local_144,local_145,local_146,&local_f00,(stringstream *)local_e10,0,false);
      std::__cxx11::string::~string((string *)&local_ee8);
      std::__cxx11::stringstream::~stringstream(local_e10);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_9e8);
      std::__cxx11::string::find((char *)&local_140,0x10e973);
      std::__cxx11::string::substr((ulong)local_a08,(ulong)&local_140);
      std::operator<<(local_9d8,local_a08);
      std::__cxx11::string::~string(local_a08);
      for (local_a0c = 0; local_a0c < local_7a4; local_a0c = local_a0c + 1) {
        std::__cxx11::stringstream::stringstream(local_b98);
        std::__cxx11::string::find((char *)&local_140,0x10e973);
        std::__cxx11::string::substr((ulong)local_bb8,(ulong)&local_140);
        poVar11 = std::operator<<(local_b88,local_bb8);
        std::operator<<(poVar11,"\\");
        std::__cxx11::string::~string(local_bb8);
        vector3::vector3(&local_bd0,(vector3 *)&look_at.z);
        vector3::vector3(&local_be8,(vector3 *)&camera_angle);
        dVar7 = nozzle_width;
        dVar6 = dStack_60;
        bVar8 = filament_color.z._7_1_;
        vector3::vector3(&local_c00,(vector3 *)local_80);
        vector3::vector3(&local_c18,(vector3 *)local_b0);
        CuttingPlane::CuttingPlane(&local_c50,(CuttingPlane *)&cutting_plane_distance);
        dVar5 = transparency;
        dVar4 = layer_only;
        dVar3 = layer_before_and;
        uVar2 = in_file_name.field_2._8_8_;
        std::__cxx11::string::string((string *)&local_c70,&local_140);
        vector3::vector3(&local_c88,(vector3 *)local_7a0);
        Generate_single_file
                  (&local_bd0,&local_be8,dVar7,dVar6,(bool)(bVar8 & 1),&local_c00,&local_c18,
                   &local_c50,dVar5,dVar4,dVar3,(double)uVar2,&local_c70,local_141,local_142,
                   local_143,local_144,local_145,local_146,&local_c88,(stringstream *)local_b98,
                   local_a0c,make_layer_video_00);
        std::__cxx11::string::~string((string *)&local_c70);
        std::__cxx11::stringstream::~stringstream(local_b98);
      }
      std::__cxx11::stringstream::~stringstream(local_9e8);
    }
    std::fstream::~fstream((void *)((long)&temp_string.field_2 + 8));
    std::__cxx11::string::~string(&local_140);
    return 0;
  }
  poVar11 = std::operator<<((ostream *)&std::cout,"Configurations file not found.\n");
  std::operator<<(poVar11,"Exit.\n");
  exit(0);
}

Assistant:

int main(int argc, char* argv[])
{
  vector3 camera_position_vector(-100, -250, 220);
  vector3 look_at(-100, 100, 30);
  double camera_angle = 60;
  double nozzle_width = 0.4;
  bool has_cutting_plane = false;
  vector3 filament_color = vector3(0.3, 0.8, 1.0) * 0.59;
  vector3 cutting_plane_normal = vector3(0.3, 0.8, 1.0) * 0.59;
  CuttingPlane cutting_plane;
  double cutting_plane_distance = 0.0;
  double transparency = 0.0;
  double layer_only = -1;
  double layer_before_and = -1;
  string in_file_name;
  bool in_file_name_specified = false;
  bool look_at_specified = false;
  bool angle_specified = false;
  bool camera_position_specified = false;
  bool layer_only_specified = false;
  bool layer_before_and_specified = false;
  bool make_layer_video = false;

  // Read configurations file.
  cout << "Reading configurations file...\n";
  fstream configure_file;
  configure_file.open("configurations.txt");
  if (!configure_file)
  {
    cout << "Configurations file not found.\n" << "Exit.\n";
    exit(0);
  }
  else
  {
    string temp_string;
    cout << "Parameters derived:\n";

    while (!configure_file.eof())
    {
      getline(configure_file, temp_string);

      if (temp_string[0] == '#' && temp_string[1] == '#')
        continue;

      int camera_location_conf_pos = temp_string.find("camera_location=v(");
      int camera_lookat_conf_pos = temp_string.find("camera_lookat=v(");
      int filament_color_conf_pos = temp_string.find("filament_color=rgb(");
      int view_angle_conf_pos = temp_string.find("view_angle=");
      int nozzle_conf_pos = temp_string.find("nozzle=");
      int file_conf_pos = temp_string.find("file=");
      int transparency_conf_pos = temp_string.find("transparency=");
      int layer_only_pos = temp_string.find("layer_only=");
      int layer_before_and_pos = temp_string.find("layer_before_and=");
      int cutting_plane_normal_pos = temp_string.find("cutting_plane_normal=");
      int cutting_plane_distance_pos = temp_string.find("cutting_plane_distance=");
      int make_layer_video_pos = temp_string.find("make_layer_video");

      //////////////////////////////////////////////////////////////////////////
      // Boolean arguments.
      if (make_layer_video_pos >= 0)
      {
        make_layer_video = true;
        cout << "make_layer_video=yes\n";
      }

      //////////////////////////////////////////////////////////////////////////
      // Vector arguments.
      if (camera_location_conf_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, camera_location_conf_pos + string("camera_location=v(").length(), camera_position_vector);
        camera_position_specified = true;
        cout << "camera_location=" << camera_position_vector << "\n";
      }

      if (camera_lookat_conf_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, camera_lookat_conf_pos + string("camera_lookat=v(").length(), look_at);
        look_at_specified = true;
        cout << "camera_lookat=" << look_at << "\n";
      }

      if (filament_color_conf_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, filament_color_conf_pos + string("filament_color=rgb(").length(), filament_color);
        cout << "filament_color=" << filament_color << "\n";
      }

      if (cutting_plane_normal_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, cutting_plane_normal_pos + string("cutting_plane_normal=v(").length(), cutting_plane_normal);
        has_cutting_plane = true;
        cout << "cutting_plane_normal=" << cutting_plane_normal << "\n";
      }

      //////////////////////////////////////////////////////////////////////////
      // Value arguments.
      if (view_angle_conf_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, view_angle_conf_pos + string("view_angle=").length(), camera_angle);
        angle_specified = true;
        cout << "view_angle=" << camera_angle << "\n";
      }

      if (nozzle_conf_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, nozzle_conf_pos + string("nozzle_diameter=").length(), nozzle_width);
        cout << "nozzle_diameter=" << nozzle_width << "\n";
      }

      if (transparency_conf_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, transparency_conf_pos + string("transparency=").length(), transparency);
        cout << "transparency=" << transparency << "\n";
      }

      if (layer_only_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, layer_only_pos + string("layer_only=").length(), layer_only);
        if (layer_only >= 0)
        {
          layer_only_specified = true;
          cout << "layer_only=" << layer_only << "\n";
        }
      }

      if (layer_before_and_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, layer_before_and_pos + string("layer_before_and=").length(), layer_before_and);
        if (layer_before_and >= 0)
        {
          layer_before_and_specified = true;
          cout << "layer_before_and=" << layer_before_and << "\n";
        }
      }

      if (cutting_plane_distance_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, cutting_plane_distance_pos + string("cutting_plane_distance=").length(), cutting_plane_distance);
        cout << "cutting_plane_distance=" << cutting_plane_distance << "\n";
      }

      //////////////////////////////////////////////////////////////////////////
      // String arguments.
      if (file_conf_pos >= 0)
      {
        in_file_name = temp_string.substr(file_conf_pos + string("file=").length(), temp_string.size() - file_conf_pos - string("file=").length());
        in_file_name_specified = true;
        istringstream ss(in_file_name);
        ss >> in_file_name;
        cout << "file=" << in_file_name << "\n";
      }
    }

    if (has_cutting_plane)
    {
      cutting_plane = CuttingPlane(cutting_plane_normal, cutting_plane_distance);
    }
  }

  // Compute the massive center.
  vector3 massive_center(0, 0, 0);
  int layer_count = 0;
  GetMassiveCenter(camera_position_vector, look_at, camera_angle, nozzle_width, has_cutting_plane,
    filament_color, cutting_plane_normal, cutting_plane, cutting_plane_distance,
    transparency, layer_only, layer_before_and, in_file_name, in_file_name_specified,
    look_at_specified, angle_specified, camera_position_specified, layer_only_specified, layer_before_and_specified,
    massive_center, layer_count);

  cout << "Layer count: " <<layer_count << "\n";
  cout << "Gcode Massive center: " << massive_center << "\n";
  cout << "Move the hole print to the original point.\n";

  // Write to the POV-Ray file.
  cout << "Writing POV-Ray file...\n";
  if (make_layer_video)
  {
    stringstream temp;
    temp << in_file_name.substr(0, in_file_name.find(".gcode"));
    // _mkdir(temp.str().c_str());

    for (int layer_index = 0; layer_index < layer_count; layer_index++)
    {
      stringstream out_file_name;
      out_file_name << in_file_name.substr(0, in_file_name.find(".gcode")) << "\\";

      Generate_single_file(camera_position_vector, look_at, camera_angle, nozzle_width, has_cutting_plane,
        filament_color, cutting_plane_normal, cutting_plane, cutting_plane_distance,
        transparency, layer_only, layer_before_and, in_file_name, in_file_name_specified,
        look_at_specified, angle_specified, camera_position_specified, layer_only_specified, layer_before_and_specified,
        massive_center, out_file_name, layer_index, make_layer_video);
    }
  }
  else
  {
    stringstream out_file_name;
    out_file_name << in_file_name.substr(0, in_file_name.find(".gcode"));
#ifdef _WIN32
    SYSTEMTIME sys;
    GetLocalTime(&sys);
    out_file_name << '_' << sys.wMonth << '_' << sys.wDay << '_' << sys.wHour << '_' << sys.wMinute;
#endif

    Generate_single_file(camera_position_vector, look_at, camera_angle, nozzle_width, has_cutting_plane,
      filament_color, cutting_plane_normal, cutting_plane, cutting_plane_distance,
      transparency, layer_only, layer_before_and, in_file_name, in_file_name_specified,
      look_at_specified, angle_specified, camera_position_specified, layer_only_specified, layer_before_and_specified,
      massive_center, out_file_name, 0, make_layer_video);
  }

  return 0;
}